

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDIS.cpp
# Opt level: O2

KBOOL __thiscall
ExampleSubscriber::OnDataReceived
          (ExampleSubscriber *this,KOCTET *Data,KUINT32 DataLength,KString *SenderIp)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Received ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1," bytes from ");
  poVar1 = std::operator<<(poVar1,(string *)SenderIp);
  std::endl<char,std::char_traits<char>>(poVar1);
  return true;
}

Assistant:

virtual KBOOL OnDataReceived( const KOCTET * Data, KUINT32 DataLength, const KString & SenderIp )
    {
        cout << "Received " << DataLength << " bytes from " << SenderIp << endl;

        // We return true here, if we return false then the data will be discarded by the connection class.
        // This means an IP address based filter could be implemented here.
        return true;
    }